

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O1

char * strpool_collate(strpool_t *pool,int *count)

{
  strpool_internal_entry_t *psVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  void *__src;
  long lVar6;
  char *__dest;
  
  if ((long)pool->entry_count < 1) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + *(int *)((long)&pool->entries->length + lVar5) + 1;
      lVar5 = lVar5 + 0x20;
    } while ((long)pool->entry_count * 0x20 != lVar5);
  }
  if (iVar3 == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (char *)(**pool->memctx)(0,(long)iVar3,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8))
    ;
    if (pcVar2 == (char *)0x0) {
      __assert_fail("strings",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x4b9,"char *strpool_collate(const strpool_t *, int *)");
    }
    *count = pool->entry_count;
    if (0 < pool->entry_count) {
      lVar5 = 8;
      lVar6 = 0;
      __dest = pcVar2;
      do {
        psVar1 = pool->entries;
        lVar4 = (long)*(int *)((long)&psVar1->data + lVar5 + 4);
        __src = (void *)(*(long *)((long)&psVar1->hash_slot + lVar5) + 8);
        *(void **)((long)&psVar1->hash_slot + lVar5) = __src;
        memcpy(__dest,__src,lVar4 + 1);
        __dest = __dest + lVar4 + 1;
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x20;
      } while (lVar6 < pool->entry_count);
    }
  }
  return pcVar2;
}

Assistant:

char* strpool_collate( strpool_t const* pool, int* count )
    {
    int size = 0;
    for( int i = 0; i < pool->entry_count; ++i ) size += pool->entries[ i ].length + 1;
    if( size == 0 ) return NULL;

    char* strings = (char*) STRPOOL_MALLOC( pool->memctx, (size_t) size );
    STRPOOL_ASSERT( strings );
    *count = pool->entry_count;
    char* ptr = strings;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        int len = pool->entries[ i ].length + 1;
        char* src = pool->entries[ i ].data += 2 * sizeof( STRPOOL_U32 );
        STRPOOL_MEMCPY( ptr, src, (size_t) len );
        ptr += len;
        }
    return strings;
    }